

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::increment
          (Integer_combination_iterator *this)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  puVar2 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  do {
    uVar1 = uVar5 + 1;
    if (puVar2[uVar5] != 0) break;
    bVar9 = uVar5 < this->k_;
    uVar5 = uVar1;
  } while (bVar9);
  uVar6 = (int)uVar1 - 1;
  puVar3 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  uVar7 = uVar6;
  while( true ) {
    uVar8 = uVar6 + 1;
    if (puVar2[uVar8] != puVar3[uVar8]) break;
    uVar6 = uVar8;
    if (puVar2[uVar8] != 0) {
      iVar4 = iVar4 + puVar2[uVar7];
      puVar2[uVar7] = 0;
      uVar7 = uVar8;
    }
  }
  if (this->k_ <= uVar6 + 1) {
    this->is_end_ = true;
    return;
  }
  uVar6 = (iVar4 + puVar2[uVar7]) - 1;
  puVar2[uVar7] = 0;
  puVar2[uVar8] = puVar2[uVar8] + 1;
  uVar7 = 0;
  while( true ) {
    if (uVar6 < puVar3[uVar7]) break;
    puVar2[uVar7] = puVar3[uVar7];
    uVar6 = uVar6 - puVar3[uVar7];
    uVar7 = uVar7 + 1;
  }
  puVar2[uVar7] = uVar6;
  return;
}

Assistant:

void increment() {
    uint j1 = 0;
    uint s = 0;
    while (value_[j1] == 0 && j1 < k_) j1++;
    uint j2 = j1 + 1;
    while (value_[j2] == bounds_[j2]) {
      if (bounds_[j2] != 0) {
        s += value_[j1];
        value_[j1] = 0;
        j1 = j2;
      }
      j2++;
    }
    if (j2 >= k_) {
      is_end_ = true;
      return;
    }
    s += value_[j1] - 1;
    value_[j1] = 0;
    value_[j2]++;
    uint i = 0;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;
  }